

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
Sweep(SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
      *this,RecyclerSweep *recyclerSweep)

{
  code *pcVar1;
  bool bVar2;
  Recycler *recycler_00;
  undefined8 *in_FS_OFFSET;
  Recycler *recycler;
  RecyclerSweep *recyclerSweep_local;
  SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
  *this_local;
  
  recycler_00 = RecyclerSweep::GetRecycler(recyclerSweep);
  bVar2 = RecyclerSweep::InPartialCollect(recyclerSweep);
  if ((!bVar2) &&
     (this->partialHeapBlockList !=
      (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,800,"(recyclerSweep.InPartialCollect() || partialHeapBlockList == nullptr)",
                       "recyclerSweep.InPartialCollect() || partialHeapBlockList == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  bVar2 = RecyclerSweep::InPartialCollect(recyclerSweep);
  if ((!bVar2) &&
     (this->partialSweptHeapBlockList !=
      (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x322,
                       "(recyclerSweep.InPartialCollect() || partialSweptHeapBlockList == nullptr)",
                       "recyclerSweep.InPartialCollect() || partialSweptHeapBlockList == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  SweepVerifyPartialBlocks(recycler_00,this->partialHeapBlockList);
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::
  SweepBucket<Memory::SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::Sweep(Memory::RecyclerSweep&)::_lambda(Memory::RecyclerSweep&)_1_>
            ((HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>> *)this
             ,recyclerSweep);
  return;
}

Assistant:

void
SmallNormalHeapBucketBase<TBlockType>::Sweep(RecyclerSweep& recyclerSweep)
{
#if ENABLE_PARTIAL_GC
#if DBG
    Recycler * recycler = recyclerSweep.GetRecycler();
    // Don't need sweep the partialHeapBlockList, the partially collected heap block list.
    // There should be nothing there that is free-able since the last time we swept

    Assert(recyclerSweep.InPartialCollect() || partialHeapBlockList == nullptr);
#if ENABLE_CONCURRENT_GC
    Assert(recyclerSweep.InPartialCollect() || partialSweptHeapBlockList == nullptr);
#endif
    this->SweepVerifyPartialBlocks(recycler, this->partialHeapBlockList);
#endif
#endif

    BaseT::SweepBucket(recyclerSweep, [](RecyclerSweep& recyclerSweep){});
}